

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O2

void mct_encode_real(int *c0,int *c1,int *c2,int n)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    lVar5 = (long)c0[uVar1];
    lVar4 = (long)c1[uVar1];
    lVar3 = (long)c2[uVar1];
    c0[uVar1] = (int)((lVar3 * 0x3a6 & 0x1000U) + lVar3 * 0x3a6 >> 0xd) +
                (int)((lVar4 * 0x12c9 & 0x1000U) + lVar4 * 0x12c9 >> 0xd) +
                (int)((lVar5 * 0x991 & 0x1000U) + lVar5 * 0x991 >> 0xd);
    c1[uVar1] = (int)((lVar3 * 0x1000 & 0x1000U) + lVar3 * 0x1000 >> 0xd) -
                ((int)((lVar4 * 0xa9a & 0x1000U) + lVar4 * 0xa9a >> 0xd) +
                (int)((lVar5 * 0x566 & 0x1000U) + lVar5 * 0x566 >> 0xd));
    c2[uVar1] = (int)((lVar5 * 0x1000 & 0x1000U) + lVar5 * 0x1000 >> 0xd) -
                ((int)((lVar3 * 0x29a & 0x1000U) + lVar3 * 0x29a >> 0xd) +
                (int)((lVar4 * 0xd66 & 0x1000U) + lVar4 * 0xd66 >> 0xd));
  }
  return;
}

Assistant:

void mct_encode_real(
		int* restrict c0,
		int* restrict c1,
		int* restrict c2,
		int n)
{
	int i;
	for(i = 0; i < n; ++i) {
		int r = c0[i];
		int g = c1[i];
		int b = c2[i];
		int y =  fix_mul(r, 2449) + fix_mul(g, 4809) + fix_mul(b, 934);
		int u = -fix_mul(r, 1382) - fix_mul(g, 2714) + fix_mul(b, 4096);
		int v =  fix_mul(r, 4096) - fix_mul(g, 3430) - fix_mul(b, 666);
		c0[i] = y;
		c1[i] = u;
		c2[i] = v;
	}
}